

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

AtomicCmpxchg * __thiscall
wasm::Builder::makeAtomicCmpxchg
          (Builder *this,uint bytes,Address offset,Expression *ptr,Expression *expected,
          Expression *replacement,Type type,Name memory)

{
  AtomicCmpxchg *this_00;
  AtomicCmpxchg *ret;
  Expression *replacement_local;
  Expression *expected_local;
  Expression *ptr_local;
  uint bytes_local;
  Builder *this_local;
  Type type_local;
  Address offset_local;
  
  this_00 = MixedArena::alloc<wasm::AtomicCmpxchg>(&this->wasm->allocator);
  this_00->bytes = (uint8_t)bytes;
  (this_00->offset).addr = offset.addr;
  this_00->ptr = ptr;
  this_00->expected = expected;
  this_00->replacement = replacement;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)25>).super_Expression.type.id = type.id;
  AtomicCmpxchg::finalize(this_00);
  wasm::Name::operator=(&this_00->memory,&memory);
  return this_00;
}

Assistant:

AtomicCmpxchg* makeAtomicCmpxchg(unsigned bytes,
                                   Address offset,
                                   Expression* ptr,
                                   Expression* expected,
                                   Expression* replacement,
                                   Type type,
                                   Name memory) {
    auto* ret = wasm.allocator.alloc<AtomicCmpxchg>();
    ret->bytes = bytes;
    ret->offset = offset;
    ret->ptr = ptr;
    ret->expected = expected;
    ret->replacement = replacement;
    ret->type = type;
    ret->finalize();
    ret->memory = memory;
    return ret;
  }